

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O3

bool ParameterTraits<bool>::convert(string *v,RepType *r)

{
  int iVar1;
  RepType RVar2;
  locale alStack_28 [8];
  
  std::locale::locale(alStack_28);
  OpenMD::toLower<std::__cxx11::string>(v,alStack_28);
  std::locale::~locale(alStack_28);
  iVar1 = std::__cxx11::string::compare((char *)v);
  RVar2 = true;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)v);
    RVar2 = false;
    if (iVar1 != 0) {
      return false;
    }
  }
  *r = RVar2;
  return true;
}

Assistant:

static bool convert(std::string v, RepType& r) {
    OpenMD::toLower(v);
    bool result = false;
    if (v == "true") {
      r      = true;
      result = true;
    } else if (v == "false") {
      r      = false;
      result = true;
    }

    return result;
  }